

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O3

CBString * actionTypeToUString(CBString *__return_storage_ptr__,UINT8 action)

{
  undefined7 in_register_00000031;
  char *s;
  
  switch((int)CONCAT71(in_register_00000031,action)) {
  case 0x32:
    Bstrlib::CBString::CBString(__return_storage_ptr__);
    return __return_storage_ptr__;
  default:
    usprintf(__return_storage_ptr__,"Unknown %02Xh",action);
    return __return_storage_ptr__;
  case 0x34:
    s = "Create";
    break;
  case 0x35:
    s = "Insert";
    break;
  case 0x36:
    s = "Replace";
    break;
  case 0x37:
    s = "Remove";
    break;
  case 0x38:
    s = "Rebuild";
    break;
  case 0x39:
    s = "Rebase";
  }
  Bstrlib::CBString::CBString(__return_storage_ptr__,s);
  return __return_storage_ptr__;
}

Assistant:

UString actionTypeToUString(const UINT8 action)
{
    switch (action) {
        case Actions::NoAction:      return UString();
        case Actions::Create:        return UString("Create");
        case Actions::Insert:        return UString("Insert");
        case Actions::Replace:       return UString("Replace");
        case Actions::Remove:        return UString("Remove");
        case Actions::Rebuild:       return UString("Rebuild");
        case Actions::Rebase:        return UString("Rebase");
    }
    
    return usprintf("Unknown %02Xh", action);
}